

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O1

int mbedtls_base64_decode(uchar *dst,size_t dlen,size_t *olen,uchar *src,size_t slen)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  uchar *puVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  
  uVar7 = 0;
  if (slen == 0) {
    uVar11 = 0;
    uVar9 = 0;
  }
  else {
    uVar11 = 0;
    uVar9 = 0;
    do {
      uVar10 = (uint)uVar7;
      uVar8 = uVar9 + 1;
      if (uVar9 + 1 < slen) {
        uVar8 = slen;
      }
      lVar12 = 0;
      do {
        if (src[lVar12 + uVar9] != ' ') {
          uVar8 = uVar9 + lVar12;
          break;
        }
        lVar12 = lVar12 + 1;
      } while (uVar8 - uVar9 != lVar12);
      uVar9 = uVar8;
      if (slen == uVar9) break;
      if (((slen - uVar9 < 2) || (src[uVar9] != '\r')) || (src[uVar9 + 1] != '\n')) {
        bVar1 = src[uVar9];
        if ((ulong)bVar1 != 10) {
          if ((int)lVar12 != 0) {
            return -0x2c;
          }
          if (bVar1 == 0x3d) {
            if (1 < uVar10) {
              return -0x2c;
            }
            uVar7 = (ulong)(uVar10 + 1);
          }
          if ((char)bVar1 < '\0') {
            return -0x2c;
          }
          if ("\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f>\x7f\x7f\x7f?456789:;<=\x7f\x7f\x7f@\x7f\x7f\x7f"
              [bVar1] == 0x7f) {
            return -0x2c;
          }
          if ("\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f>\x7f\x7f\x7f?456789:;<=\x7f\x7f\x7f@\x7f\x7f\x7f"
              [bVar1] < 0x40 && (int)uVar7 != 0) {
            return -0x2c;
          }
          uVar11 = uVar11 + 1;
        }
      }
      uVar10 = (uint)uVar7;
      uVar9 = uVar9 + 1;
    } while (uVar9 < slen);
    uVar7 = (ulong)uVar10;
  }
  iVar3 = 0;
  if (uVar11 == 0) {
    sVar4 = 0;
  }
  else {
    sVar4 = (ulong)(((uint)uVar11 & 7) * 6 + 7 >> 3) +
            ((uVar11 >> 2 & 0xfffffffffffffffe) * 3 - uVar7);
    iVar3 = -0x2a;
    if ((dst != (uchar *)0x0) && (sVar4 <= dlen)) {
      puVar5 = dst;
      if (uVar9 != 0) {
        uVar6 = 3;
        uVar7 = 0;
        uVar10 = 0;
        lVar12 = 0;
        do {
          uVar11 = (ulong)src[uVar7];
          if ((0x20 < uVar11) || ((0x100002400U >> (uVar11 & 0x3f) & 1) == 0)) {
            uVar6 = uVar6 - (uVar11 == 0x3d);
            uVar2 = uVar10 << 6;
            uVar10 = "\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f>\x7f\x7f\x7f?456789:;<=\x7f\x7f\x7f@\x7f\x7f\x7f"
                     [uVar11] & 0x3f | uVar2;
            lVar12 = lVar12 + 1;
            if (lVar12 == 4) {
              if (uVar6 != 0) {
                *puVar5 = (uchar)(uVar2 >> 0x10);
                puVar5 = puVar5 + 1;
              }
              if (1 < uVar6) {
                *puVar5 = (uchar)(uVar2 >> 8);
                puVar5 = puVar5 + 1;
              }
              if (2 < uVar6) {
                *puVar5 = (uchar)uVar10;
                puVar5 = puVar5 + 1;
              }
              lVar12 = 0;
            }
          }
          uVar7 = uVar7 + 1;
        } while (uVar9 != uVar7);
      }
      sVar4 = (long)puVar5 - (long)dst;
      iVar3 = 0;
    }
  }
  *olen = sVar4;
  return iVar3;
}

Assistant:

int mbedtls_base64_decode( unsigned char *dst, size_t dlen, size_t *olen,
                   const unsigned char *src, size_t slen )
{
    size_t i, n;
    uint32_t j, x;
    unsigned char *p;

    /* First pass: check for validity and get output length */
    for( i = n = j = 0; i < slen; i++ )
    {
        /* Skip spaces before checking for EOL */
        x = 0;
        while( i < slen && src[i] == ' ' )
        {
            ++i;
            ++x;
        }

        /* Spaces at end of buffer are OK */
        if( i == slen )
            break;

        if( ( slen - i ) >= 2 &&
            src[i] == '\r' && src[i + 1] == '\n' )
            continue;

        if( src[i] == '\n' )
            continue;

        /* Space inside a line is an error */
        if( x != 0 )
            return( MBEDTLS_ERR_BASE64_INVALID_CHARACTER );

        if( src[i] == '=' && ++j > 2 )
            return( MBEDTLS_ERR_BASE64_INVALID_CHARACTER );

        if( src[i] > 127 || base64_dec_map[src[i]] == 127 )
            return( MBEDTLS_ERR_BASE64_INVALID_CHARACTER );

        if( base64_dec_map[src[i]] < 64 && j != 0 )
            return( MBEDTLS_ERR_BASE64_INVALID_CHARACTER );

        n++;
    }

    if( n == 0 )
    {
        *olen = 0;
        return( 0 );
    }

    /* The following expression is to calculate the following formula without
     * risk of integer overflow in n:
     *     n = ( ( n * 6 ) + 7 ) >> 3;
     */
    n = ( 6 * ( n >> 3 ) ) + ( ( 6 * ( n & 0x7 ) + 7 ) >> 3 );
    n -= j;

    if( dst == NULL || dlen < n )
    {
        *olen = n;
        return( MBEDTLS_ERR_BASE64_BUFFER_TOO_SMALL );
    }

   for( j = 3, n = x = 0, p = dst; i > 0; i--, src++ )
   {
        if( *src == '\r' || *src == '\n' || *src == ' ' )
            continue;

        j -= ( base64_dec_map[*src] == 64 );
        x  = ( x << 6 ) | ( base64_dec_map[*src] & 0x3F );

        if( ++n == 4 )
        {
            n = 0;
            if( j > 0 ) *p++ = (unsigned char)( x >> 16 );
            if( j > 1 ) *p++ = (unsigned char)( x >>  8 );
            if( j > 2 ) *p++ = (unsigned char)( x       );
        }
    }

    *olen = p - dst;

    return( 0 );
}